

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O3

bool __thiscall ON_Brep::IsValidFaceGeometry(ON_Brep *this,int face_index,ON_TextLog *text_log)

{
  ON_BrepFace *pOVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar2 = (ulong)(uint)face_index;
  if (face_index < 0 ||
      (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count <=
      face_index) {
    if (text_log == (ON_TextLog *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = false;
      ON_TextLog::Print(text_log,"brep face_index = %d (should be >=0 and <%d=brep.m_F.Count() ).\n"
                        ,uVar2);
    }
  }
  else {
    pOVar1 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
    bVar3 = pOVar1[uVar2].m_face_index == face_index;
    if (text_log != (ON_TextLog *)0x0 && !bVar3) {
      bVar3 = false;
      ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar2);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"face.m_face_index = %d (should be %d).\n",
                        (ulong)(uint)pOVar1[uVar2].m_face_index,uVar2);
      ON_TextLog::PopIndent(text_log);
    }
  }
  return bVar3;
}

Assistant:

bool
ON_Brep::IsValidFaceGeometry( int face_index, ON_TextLog* text_log ) const
{
  if ( face_index < 0 || face_index >= m_F.Count() )
  {
    if ( text_log )
      text_log->Print("brep face_index = %d (should be >=0 and <%d=brep.m_F.Count() ).\n",
                      face_index, m_F.Count());
    return false;
  }
  const ON_BrepFace& face = m_F[face_index];
  if ( face.m_face_index != face_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
      text_log->PushIndent();
      text_log->Print("face.m_face_index = %d (should be %d).\n",
                       face.m_face_index, face_index );
      text_log->PopIndent();
    }
    return false;
  }
  return true;
}